

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O3

void __thiscall leveldb::TableBuilder::Add(TableBuilder *this,Slice *key,Slice *value)

{
  Rep *pRVar1;
  Comparator *pCVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  long in_FS_OFFSET;
  string handle_encoding;
  Slice local_70;
  Slice local_60;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar1 = this->rep_;
  if (pRVar1->closed == true) {
    __assert_fail("!r->closed",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/table_builder.cc"
                  ,0x60,"void leveldb::TableBuilder::Add(const Slice &, const Slice &)");
  }
  bVar3 = ok(this);
  if (bVar3) {
    if (0 < pRVar1->num_entries) {
      local_50._M_dataplus._M_p = (pRVar1->last_key)._M_dataplus._M_p;
      local_50._M_string_length = (pRVar1->last_key)._M_string_length;
      iVar4 = (*((pRVar1->options).comparator)->_vptr_Comparator[2])();
      if (iVar4 < 1) {
        __assert_fail("r->options.comparator->Compare(key, Slice(r->last_key)) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/table_builder.cc"
                      ,99,"void leveldb::TableBuilder::Add(const Slice &, const Slice &)");
      }
    }
    if (pRVar1->pending_index_entry == true) {
      if ((pRVar1->data_block).buffer_._M_string_length != 0) {
        __assert_fail("r->data_block.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/table_builder.cc"
                      ,0x67,"void leveldb::TableBuilder::Add(const Slice &, const Slice &)");
      }
      pCVar2 = (pRVar1->options).comparator;
      (*pCVar2->_vptr_Comparator[4])(pCVar2,&pRVar1->last_key,key);
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      BlockHandle::EncodeTo(&pRVar1->pending_handle,&local_50);
      local_60.data_ = (pRVar1->last_key)._M_dataplus._M_p;
      local_60.size_ = (pRVar1->last_key)._M_string_length;
      local_70.data_ = local_50._M_dataplus._M_p;
      local_70.size_ = local_50._M_string_length;
      BlockBuilder::Add(&pRVar1->index_block,&local_60,&local_70);
      pRVar1->pending_index_entry = false;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
    }
    if (pRVar1->filter_block != (FilterBlockBuilder *)0x0) {
      FilterBlockBuilder::AddKey(pRVar1->filter_block,key);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&pRVar1->last_key,0,(pRVar1->last_key)._M_string_length,key->data_,key->size_);
    pRVar1->num_entries = pRVar1->num_entries + 1;
    BlockBuilder::Add(&pRVar1->data_block,key,value);
    sVar5 = BlockBuilder::CurrentSizeEstimate(&pRVar1->data_block);
    if ((pRVar1->options).block_size <= sVar5) {
      Flush(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TableBuilder::Add(const Slice& key, const Slice& value) {
  Rep* r = rep_;
  assert(!r->closed);
  if (!ok()) return;
  if (r->num_entries > 0) {
    assert(r->options.comparator->Compare(key, Slice(r->last_key)) > 0);
  }

  if (r->pending_index_entry) {
    assert(r->data_block.empty());
    r->options.comparator->FindShortestSeparator(&r->last_key, key);
    std::string handle_encoding;
    r->pending_handle.EncodeTo(&handle_encoding);
    r->index_block.Add(r->last_key, Slice(handle_encoding));
    r->pending_index_entry = false;
  }

  if (r->filter_block != nullptr) {
    r->filter_block->AddKey(key);
  }

  r->last_key.assign(key.data(), key.size());
  r->num_entries++;
  r->data_block.Add(key, value);

  const size_t estimated_block_size = r->data_block.CurrentSizeEstimate();
  if (estimated_block_size >= r->options.block_size) {
    Flush();
  }
}